

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

FArchive * operator<<(FArchive *arc,acsdefered_t **defertop)

{
  undefined8 in_RAX;
  FArchive *pFVar1;
  acsdefered_t *paVar2;
  BYTE more;
  BYTE type;
  
  if (arc->m_Storing == false) {
    while( true ) {
      FArchive::operator<<(arc,&more);
      more = (BYTE)((ulong)in_RAX >> 0x30);
      if (more == '\0') break;
      paVar2 = (acsdefered_t *)operator_new(0x20);
      ((acsdefered_t *)defertop)->next = paVar2;
      FArchive::operator<<(arc,&more);
      paVar2 = ((acsdefered_t *)defertop)->next;
      paVar2->type = (uint)more;
      P_SerializeACSScriptNumber(arc,&paVar2->script,false);
      pFVar1 = FArchive::operator<<(arc,(DWORD *)&((acsdefered_t *)defertop)->next->playernum);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)((acsdefered_t *)defertop)->next->args);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)(((acsdefered_t *)defertop)->next->args + 1));
      FArchive::operator<<(pFVar1,(DWORD *)(((acsdefered_t *)defertop)->next->args + 2));
      defertop = &((acsdefered_t *)defertop)->next->next;
    }
    ((acsdefered_t *)defertop)->next = (acsdefered_t *)0x0;
  }
  else {
    for (paVar2 = *defertop; paVar2 != (acsdefered_t *)0x0; paVar2 = paVar2->next) {
      FArchive::operator<<(arc,&more);
      FArchive::operator<<(arc,&type);
      P_SerializeACSScriptNumber(arc,&paVar2->script,false);
      pFVar1 = FArchive::operator<<(arc,(DWORD *)&paVar2->playernum);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)paVar2->args);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)(paVar2->args + 1));
      FArchive::operator<<(pFVar1,(DWORD *)(paVar2->args + 2));
    }
    FArchive::operator<<(arc,&more);
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, acsdefered_t *&defertop)
{
	BYTE more;

	if (arc.IsStoring ())
	{
		acsdefered_t *defer = defertop;
		more = 1;
		while (defer)
		{
			BYTE type;
			arc << more;
			type = (BYTE)defer->type;
			arc << type;
			P_SerializeACSScriptNumber(arc, defer->script, false);
			arc << defer->playernum << defer->args[0] << defer->args[1] << defer->args[2];
			defer = defer->next;
		}
		more = 0;
		arc << more;
	}
	else
	{
		acsdefered_t **defer = &defertop;

		arc << more;
		while (more)
		{
			*defer = new acsdefered_t;
			arc << more;
			(*defer)->type = (acsdefered_t::EType)more;
			P_SerializeACSScriptNumber(arc, (*defer)->script, false);
			arc << (*defer)->playernum << (*defer)->args[0] << (*defer)->args[1] << (*defer)->args[2];
			defer = &((*defer)->next);
			arc << more;
		}
		*defer = NULL;
	}
	return arc;
}